

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
                  *this,char code,bool ignore_zero)

{
  int iVar1;
  Reference RVar2;
  NumericExpr NVar3;
  NumericExpr NVar4;
  undefined7 in_register_00000031;
  int iVar5;
  bool bVar6;
  double dVar7;
  
  iVar5 = (int)CONCAT71(in_register_00000031,code);
  switch(iVar5) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    dVar7 = ReadConstant(this,code);
    if (dVar7 != 0.0 || !ignore_zero) {
      MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"number");
    }
    break;
  case 0x6f:
    iVar5 = ReadOpCode(this);
    NVar3 = ReadNumericExpr(this,iVar5);
    return (NumericExpr)NVar3.id_;
  case 0x76:
    RVar2 = DoReadReference(this);
    return (NumericExpr)RVar2.id_;
  default:
    if (iVar5 == 0x66) {
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      iVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
      MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"call expression");
      iVar5 = 0;
      if (0 < iVar1) {
        iVar5 = iVar1;
      }
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        ReadSymbolicExpr(this);
      }
      NVar4 = NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndCall
                        ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)this->handler_);
      return (NumericExpr)NVar4.id_;
    }
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
    BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x213272);
  }
  return (NumericExpr)NULL_ID;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}